

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

void Util::Eigen2csv(string *file,MatrixXd *mat)

{
  byte bVar1;
  _Setprecision _Var2;
  Index IVar3;
  ostream *poVar4;
  _Ios_Openmode in_EDI;
  int jj;
  int ii;
  ofstream f;
  int width;
  int height;
  Scalar *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int local_230;
  int local_22c;
  string local_218 [512];
  int local_18;
  int local_14;
  
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x114a13);
  local_14 = (int)IVar3;
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x114a24);
  local_18 = (int)IVar3;
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,in_EDI);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error: Unable to open file!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = (ostream *)std::ostream::operator<<(local_218,std::fixed);
  _Var2 = std::setprecision(0x11);
  std::operator<<(poVar4,_Var2);
  for (local_22c = 0; local_22c < local_14; local_22c = local_22c + 1) {
    for (local_230 = 0; local_230 < local_18; local_230 = local_230 + 1) {
      in_stack_fffffffffffffd88 =
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(_Var2._M_n,in_stack_fffffffffffffd90),
                      (Index)in_stack_fffffffffffffd88,0x114b38);
      std::ostream::operator<<(local_218,*in_stack_fffffffffffffd88);
      if (local_230 != local_18 + -1) {
        std::operator<<((ostream *)local_218,", ");
      }
    }
    std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Eigen2csv(std::string file, Eigen::MatrixXd mat){

		//locals
		int height = mat.rows();
		int width = mat.cols();

		//open file
		std::ofstream f;
		f.open(file);
		if(!f.is_open()){
			std::cout << "Error: Unable to open file!" << std::endl;
		}

		//set precision
		f << std::fixed << std::setprecision(17);

		//write
		for (int ii = 0; ii < height; ++ii) {
			for (int jj = 0; jj < width; ++jj) {
			
				// write element
				f << mat(ii,jj);

				//write comma
				if(jj != (width-1)){
					f << ", ";
				}

			}

			//newline
			f << std::endl;
		}

		f.close();


	}